

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

string * EnvironmentTypeToStr_abi_cxx11_(EnvironmentType environmentType)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  uint in_ESI;
  string *in_RDI;
  string *psVar1;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d [16];
  allocator<char> local_d [13];
  
  this = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ulong)in_ESI;
  psVar1 = in_RDI;
  switch(this) {
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_d);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_1d);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_1f);
    break;
  case (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_20);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)psVar1,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(&local_21);
  }
  return psVar1;
}

Assistant:

std::string EnvironmentTypeToStr(EnvironmentType environmentType)
{
    switch (environmentType) {
    case ENV_TYPE_2D:
        return std::string("2d");
    case ENV_TYPE_2DUU:
        return std::string("2duu");
    case ENV_TYPE_XYTHETA:
        return std::string("xytheta");
    case ENV_TYPE_XYTHETAMLEV:
        return std::string("xythetamlev");
    case ENV_TYPE_ROBARM:
        return std::string("robarm");
    default:
        return std::string("invalid");
    }
}